

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManPrintCollect2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    if (0 < (long)vNodes->nSize) {
      lVar3 = 0;
      do {
        if (vNodes->pArray[lVar3] == (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555) {
          return;
        }
        lVar3 = lVar3 + 1;
      } while (vNodes->nSize != lVar3);
    }
    if ((*(ulong *)pObj & 0x1fffffff) != 0x1fffffff) {
      Gia_ManPrintCollect2_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vNodes);
      uVar1 = (uint)*(undefined8 *)pObj;
      if (-1 < (int)uVar1 && (~uVar1 & 0x1fffffff) != 0) {
        Gia_ManPrintCollect2_rec
                  (p,pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff),vNodes
                  );
      }
    }
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
      if ((p->pMuxes != (uint *)0x0) &&
         (uVar1 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555],
         uVar1 != 0)) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (p->nObjs <= (int)(uVar1 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Gia_ManPrintCollect2_rec(p,pGVar2 + (uVar1 >> 1),vNodes);
        pGVar2 = p->pObjs;
      }
      if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
        Vec_IntPush(vNodes,(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555);
        return;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintCollect2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) >= 0 )
        return;
    if ( Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin0(pObj), vNodes );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin1(pObj), vNodes );
    if ( Gia_ObjIsMux(p, pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin2(p, pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}